

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O1

llb_build_value * llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo)

{
  BuildValue *this;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  uint64_t in_stack_00000030;
  FileInfo local_d0;
  BuildValue local_80;
  
  this = (BuildValue *)operator_new(0x70);
  local_d0.checksum.bytes[0x10] = '\0';
  local_d0.checksum.bytes[0x11] = '\0';
  local_d0.checksum.bytes[0x12] = '\0';
  local_d0.checksum.bytes[0x13] = '\0';
  local_d0.checksum.bytes[0x14] = '\0';
  local_d0.checksum.bytes[0x15] = '\0';
  local_d0.checksum.bytes[0x16] = '\0';
  local_d0.checksum.bytes[0x17] = '\0';
  local_d0.checksum.bytes[0x18] = '\0';
  local_d0.checksum.bytes[0x19] = '\0';
  local_d0.checksum.bytes[0x1a] = '\0';
  local_d0.checksum.bytes[0x1b] = '\0';
  local_d0.checksum.bytes[0x1c] = '\0';
  local_d0.checksum.bytes[0x1d] = '\0';
  local_d0.checksum.bytes[0x1e] = '\0';
  local_d0.checksum.bytes[0x1f] = '\0';
  local_d0.checksum.bytes[0] = '\0';
  local_d0.checksum.bytes[1] = '\0';
  local_d0.checksum.bytes[2] = '\0';
  local_d0.checksum.bytes[3] = '\0';
  local_d0.checksum.bytes[4] = '\0';
  local_d0.checksum.bytes[5] = '\0';
  local_d0.checksum.bytes[6] = '\0';
  local_d0.checksum.bytes[7] = '\0';
  local_d0.checksum.bytes[8] = '\0';
  local_d0.checksum.bytes[9] = '\0';
  local_d0.checksum.bytes[10] = '\0';
  local_d0.checksum.bytes[0xb] = '\0';
  local_d0.checksum.bytes[0xc] = '\0';
  local_d0.checksum.bytes[0xd] = '\0';
  local_d0.checksum.bytes[0xe] = '\0';
  local_d0.checksum.bytes[0xf] = '\0';
  local_d0.modTime.nanoseconds = in_stack_00000030;
  if ((((in_stack_00000018 != 0 || in_stack_00000020 != 0) ||
       (in_stack_00000008 != 0 || in_stack_00000010 != 0)) || in_stack_00000028 != 0) ||
      in_stack_00000030 != 0) {
    outputInfos.Length = 1;
    outputInfos.Data = &local_d0;
    llbuild::buildsystem::BuildValue::BuildValue
              (&local_80,ExistingInput,outputInfos,(CommandSignature)0x0);
    llbuild::buildsystem::BuildValue::BuildValue(this,&local_80);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
    return (llb_build_value *)this;
  }
  __assert_fail("!outputInfo.isMissing()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0x113,
                "static BuildValue llbuild::buildsystem::BuildValue::makeExistingInput(FileInfo)");
}

Assistant:

llb_build_value *llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo) {
  return (llb_build_value *)new CAPIBuildValue(BuildValue::makeExistingInput(convertFileInfo(fileInfo)));
}